

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginFunctionBody
          (BinaryReaderObjdump *this,Index index,Offset size)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined1 local_38 [8];
  string_view name;
  Offset size_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  name._M_str = (char *)size;
  PrintDetails(this," - func[%u] size=%zd",(ulong)index,size);
  _local_38 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  if (!bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pvVar3);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginFunctionBody(Index index, Offset size) {
  PrintDetails(" - func[%" PRIindex "] size=%" PRIzd, index, size);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}